

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O0

void __thiscall
MonahanPlanner::MonahanPlanner
          (MonahanPlanner *this,PlanningUnitDecPOMDPDiscrete *pu,bool doIncPrune)

{
  PlanningUnitDecPOMDPDiscrete *this_00;
  value_type_conflict2 *__value;
  byte in_DL;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  AlphaVectorPlanning *in_stack_ffffffffffffff88;
  allocator_type *__a;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__n;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  
  AlphaVectorPlanning::AlphaVectorPlanning(&this->super_AlphaVectorPlanning,pu);
  (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__MonahanPlanner_00d0efc0;
  *(byte *)&in_RDI[0xc].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = in_DL & 1;
  __n = in_RDI + 0xd;
  std::
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
            *)0x93cf1a);
  *(undefined1 *)
   &in_RDI[0xe].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  *(undefined1 *)
   ((long)&in_RDI[0xe].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 1) = 0;
  this_00 = AlphaVectorPlanning::GetPU(in_stack_ffffffffffffff88);
  __value = (value_type_conflict2 *)PlanningUnit::GetHorizon((PlanningUnit *)this_00);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __a = (allocator_type *)&stack0xffffffffffffffcf;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x93cf70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_RDI,(size_type)__n,__value,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x93cf95);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_ffffffffffffffc8,(allocator<char> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffce);
  return;
}

Assistant:

MonahanPlanner::MonahanPlanner(const PlanningUnitDecPOMDPDiscrete* pu,
                               bool doIncPrune) :
    AlphaVectorPlanning(pu),
    _m_doIncPrune(doIncPrune),
    _m_initialized(false),
    _m_alreadyComputed(false),
    _m_maxNrAlphas(GetPU()->GetHorizon(),0),
    _m_resultsFilename("")
{
}